

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void pipe_list(t_pipe *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  t_atomtype tVar2;
  t_hang_conflict *owner;
  t_gpointer *ptVar3;
  t_symbol *ptVar4;
  _clock *p_Var5;
  t_float tVar6;
  float local_74;
  word *local_60;
  t_word *w;
  t_atom *ap;
  int n;
  int i;
  t_pipeout *p;
  t_gpointer *gp2;
  t_gpointer *gp;
  t_hang_conflict *h;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_pipe *x_local;
  
  owner = (t_hang_conflict *)getbytes((long)(x->x_n + -1) * 8 + 0x28);
  iVar1 = x->x_n;
  ptVar3 = (t_gpointer *)getbytes((long)x->x_nptr * 0x18);
  owner->h_gp = ptVar3;
  av_local._4_4_ = ac;
  if (iVar1 < ac) {
    av_local._4_4_ = iVar1;
    if (av[iVar1].a_type == A_FLOAT) {
      x->x_deltime = av[iVar1].a_w.w_float;
    }
    else {
      pd_error(x,"pipe: symbol or pointer in time inlet");
    }
  }
  ap._4_4_ = 0;
  gp2 = x->x_gp;
  _n = x->x_vec;
  w = (t_word *)av;
  for (; ap._4_4_ < av_local._4_4_; ap._4_4_ = ap._4_4_ + 1) {
    tVar2 = (_n->p_atom).a_type;
    if (tVar2 == A_FLOAT) {
      tVar6 = atom_getfloat((t_atom *)w);
      (_n->p_atom).a_w.w_float = tVar6;
    }
    else if (tVar2 == A_SYMBOL) {
      ptVar4 = atom_getsymbol((t_atom *)w);
      (_n->p_atom).a_w.w_symbol = ptVar4;
    }
    else if (tVar2 == A_POINTER) {
      gpointer_unset(gp2);
      if (w->w_index == 3) {
        ptVar4 = w[1].w_symbol;
        gp2->gp_un = (anon_union_8_2_4cf7151e_for_gp_un)ptVar4->s_name;
        *(_class ***)&gp2->gp_valid = ptVar4->s_thing;
        gp2->gp_stub = (t_gstub *)ptVar4->s_next;
        if (gp2->gp_stub != (t_gstub *)0x0) {
          gp2->gp_stub->gs_refcount = gp2->gp_stub->gs_refcount + 1;
        }
      }
      else {
        pd_error(x,"pipe: bad pointer");
      }
      gp2 = gp2 + 1;
    }
    _n = _n + 1;
    w = w + 2;
  }
  ap._4_4_ = 0;
  gp2 = x->x_gp;
  p = (t_pipeout *)owner->h_gp;
  _n = x->x_vec;
  local_60 = owner->h_vec;
  for (; ap._4_4_ < iVar1; ap._4_4_ = ap._4_4_ + 1) {
    if ((_n->p_atom).a_type == A_POINTER) {
      if (gp2->gp_stub != (t_gstub *)0x0) {
        gp2->gp_stub->gs_refcount = gp2->gp_stub->gs_refcount + 1;
      }
      local_60->w_symbol = (t_symbol *)p;
      *(anon_union_8_2_4cf7151e_for_gp_un *)&p->p_atom = gp2->gp_un;
      (p->p_atom).a_w = *(word *)&gp2->gp_valid;
      p->p_outlet = (_outlet *)gp2->gp_stub;
      p = p + 1;
      gp2 = gp2 + 1;
    }
    else {
      *local_60 = (_n->p_atom).a_w;
    }
    _n = _n + 1;
    local_60 = local_60 + 1;
  }
  owner->h_next = x->x_hang;
  x->x_hang = owner;
  owner->h_owner = x;
  p_Var5 = clock_new(owner,hang_tick);
  owner->h_clock = p_Var5;
  if (x->x_deltime < 0.0) {
    local_74 = 0.0;
  }
  else {
    local_74 = x->x_deltime;
  }
  clock_delay(owner->h_clock,(double)local_74);
  return;
}

Assistant:

static void pipe_list(t_pipe *x, t_symbol *s, int ac, t_atom *av)
{
    t_hang *h = (t_hang *)
        getbytes(sizeof(*h) + (x->x_n - 1) * sizeof(*h->h_vec));
    t_gpointer *gp, *gp2;
    t_pipeout *p;
    int i, n = x->x_n;
    t_atom *ap;
    t_word *w;
    h->h_gp = (t_gpointer *)getbytes(x->x_nptr * sizeof(t_gpointer));
    if (ac > n)
    {
        if (av[n].a_type == A_FLOAT)
            x->x_deltime = av[n].a_w.w_float;
        else pd_error(x, "pipe: symbol or pointer in time inlet");
        ac = n;
    }
    for (i = 0, gp = x->x_gp, p = x->x_vec, ap = av; i < ac;
        i++, p++, ap++)
    {
        switch (p->p_atom.a_type)
        {
        case A_FLOAT: p->p_atom.a_w.w_float = atom_getfloat(ap); break;
        case A_SYMBOL: p->p_atom.a_w.w_symbol = atom_getsymbol(ap); break;
        case A_POINTER:
            gpointer_unset(gp);
            if (ap->a_type != A_POINTER)
                pd_error(x, "pipe: bad pointer");
            else
            {
                *gp = *(ap->a_w.w_gpointer);
                if (gp->gp_stub) gp->gp_stub->gs_refcount++;
            }
            gp++;
        default: break;
        }
    }
    for (i = 0, gp = x->x_gp, gp2 = h->h_gp, p = x->x_vec, w = h->h_vec;
        i < n; i++, p++, w++)
    {
        if (p->p_atom.a_type == A_POINTER)
        {
            if (gp->gp_stub) gp->gp_stub->gs_refcount++;
            w->w_gpointer = gp2;
            *gp2++ = *gp++;
        }
        else *w = p->p_atom.a_w;
    }
    h->h_next = x->x_hang;
    x->x_hang = h;
    h->h_owner = x;
    h->h_clock = clock_new(h, (t_method)hang_tick);
    clock_delay(h->h_clock, (x->x_deltime >= 0 ? x->x_deltime : 0));
}